

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

size_type anon_unknown.dwarf_f716::filename_pos(string_type *str,size_type end_pos)

{
  bool bVar1;
  value_type *pvVar2;
  long lVar3;
  size_type local_30;
  size_type pos;
  size_type end_pos_local;
  string_type *str_local;
  
  if (end_pos == 2) {
    pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
    bVar1 = is_separator(*pvVar2);
    if (bVar1) {
      pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
      bVar1 = is_separator(*pvVar2);
      if (bVar1) {
        return 0;
      }
    }
  }
  if (end_pos != 0) {
    pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
    bVar1 = is_separator(*pvVar2);
    if (bVar1) {
      return end_pos - 1;
    }
  }
  lVar3 = std::__cxx11::string::find_last_of((char *)str,0x120c02);
  if (lVar3 == -1) {
LAB_0011a0f4:
    local_30 = 0;
  }
  else {
    if (lVar3 == 1) {
      pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
      bVar1 = is_separator(*pvVar2);
      if (bVar1) goto LAB_0011a0f4;
    }
    local_30 = lVar3 + 1;
  }
  return local_30;
}

Assistant:

size_type filename_pos(const string_type & str,
                          size_type end_pos) // end_pos is past-the-end position
    // return 0 if str itself is filename (or empty)
  {
    // case: "//"
    if (end_pos == 2 
      && is_separator(str[0])
      && is_separator(str[1])) return 0;

    // case: ends in "/"
    if (end_pos && is_separator(str[end_pos-1]))
      return end_pos-1;
    
    // set pos to start of last element
    size_type pos(str.find_last_of(separators, end_pos-1));

#   ifdef BOOST_WINDOWS_API
    if (pos == string_type::npos && end_pos > 1)
      pos = str.find_last_of(colon, end_pos-2);
#   endif

    return (pos == string_type::npos // path itself must be a filename (or empty)
      || (pos == 1 && is_separator(str[0]))) // or net
        ? 0 // so filename is entire string
        : pos + 1; // or starts after delimiter
  }